

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O1

string * __thiscall
cmInstallCommandArguments::GetComponent_abi_cxx11_(cmInstallCommandArguments *this)

{
  int iVar1;
  string *psVar2;
  cmInstallCommandArguments *pcVar3;
  
  do {
    pcVar3 = this;
    if ((pcVar3->Component).String._M_string_length != 0) {
      return &(pcVar3->Component).String;
    }
    this = pcVar3->GenericArguments;
  } while (pcVar3->GenericArguments != (cmInstallCommandArguments *)0x0);
  if ((pcVar3->DefaultComponentName)._M_string_length == 0) {
    psVar2 = &GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_;
    if ((GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_),
       iVar1 != 0)) {
      GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_.field_2;
      psVar2 = &GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_,"Unspecified"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_);
    }
  }
  else {
    psVar2 = &pcVar3->DefaultComponentName;
  }
  return psVar2;
}

Assistant:

const std::string& cmInstallCommandArguments::GetComponent() const
{
  if (!this->Component.GetString().empty())
    {
    return this->Component.GetString();
    }
  if (this->GenericArguments!=0)
    {
    return this->GenericArguments->GetComponent();
    }
  if (!this->DefaultComponentName.empty())
    {
    return this->DefaultComponentName;
    }
  static std::string unspecifiedComponent = "Unspecified";
  return unspecifiedComponent;
}